

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::
int_writer<unsigned___int128,_duckdb_fmt::v6::basic_format_specs<wchar_t>_>::on_oct
          (int_writer<unsigned___int128,_duckdb_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  basic_format_specs<wchar_t> *pbVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  format_specs local_d8;
  ulong local_a8;
  ulong uStack_a0;
  wchar_t local_98 [2];
  wchar_t awStack_90 [6];
  padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::int_writer<unsigned___int128,_duckdb_fmt::v6::basic_format_specs<wchar_t>_>::bin_writer<3>_>
  local_78;
  
  local_78.f.abs_value._0_8_ = (ulong)this->abs_value;
  local_78.f.abs_value._8_8_ = *(ulong *)((long)&this->abs_value + 8);
  lVar4 = 0;
  uVar5 = local_78.f.abs_value._8_8_;
  uVar7 = (ulong)local_78.f.abs_value;
  do {
    uVar2 = uVar5 << 0x3d;
    lVar4 = lVar4 + 1;
    bVar8 = 7 < uVar7;
    bVar9 = uVar5 != 0;
    uVar3 = -uVar5;
    uVar5 = uVar5 >> 3;
    uVar7 = uVar2 | uVar7 >> 3;
  } while (bVar9 || uVar3 < bVar8);
  pbVar1 = this->specs;
  local_78.f.num_digits = (int)lVar4;
  if (((char)pbVar1->field_0x9 < '\0') &&
     (((ulong)local_78.f.abs_value != 0 || local_78.f.abs_value._8_8_ != 0) &&
      pbVar1->precision <= local_78.f.num_digits)) {
    uVar6 = this->prefix_size;
    this->prefix_size = uVar6 + 1;
    this->prefix[uVar6] = '0';
  }
  local_78.prefix.size_ = (size_t)this->prefix_size;
  local_d8._32_8_ = *(undefined8 *)((pbVar1->fill).data_ + 5);
  local_d8.width = pbVar1->width;
  local_d8.precision = pbVar1->precision;
  uStack_a0._0_1_ = pbVar1->type;
  uStack_a0._1_3_ = *(undefined3 *)&pbVar1->field_0x9;
  uStack_a0._4_4_ = (pbVar1->fill).data_[0];
  local_d8.fill.data_._4_8_ = *(undefined8 *)((pbVar1->fill).data_ + 1);
  local_d8.fill.data_._12_8_ = *(undefined8 *)((pbVar1->fill).data_ + 3);
  local_78.size_ = local_78.prefix.size_ + lVar4;
  local_d8._9_1_ = SUB31(uStack_a0._1_3_,0);
  local_78.fill = uStack_a0._4_4_;
  local_d8._8_8_ = uStack_a0;
  if ((local_d8._9_1_ & 0xf) == 4) {
    uVar5 = local_d8._0_8_ & 0xffffffff;
    local_78.padding = 0;
    if (local_78.size_ <= uVar5) {
      local_78.padding = uVar5 - local_78.size_;
      local_78.size_ = uVar5;
    }
  }
  else {
    uVar6 = local_78.f.num_digits;
    if (local_78.f.num_digits < (int)local_d8.precision) {
      uVar6 = local_d8.precision;
    }
    if (local_78.f.num_digits < (int)local_d8.precision) {
      local_78.fill = L'0';
      local_78.size_ = (uint)local_d8.precision + local_78.prefix.size_;
    }
    local_78.padding = (ulong)(uVar6 - local_78.f.num_digits);
    if ((uStack_a0 & 0xf00) == 0) {
      local_d8._8_8_ = uStack_a0 | 0x200;
    }
  }
  local_78.prefix.data_ = this->prefix;
  local_a8 = local_d8._0_8_;
  local_98 = (wchar_t  [2])local_d8.fill.data_._4_8_;
  awStack_90._0_8_ = local_d8.fill.data_._12_8_;
  awStack_90._8_8_ = local_d8._32_8_;
  basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::
  write_padded<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned__int128,duckdb_fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>>
            ((basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>> *)this->writer,&local_d8,&local_78
            );
  return;
}

Assistant:

void on_oct() {
      int num_digits = count_digits<3>(abs_value);
      if (specs.alt && specs.precision <= num_digits && abs_value != 0) {
        // Octal prefix '0' is counted as a digit, so only add it if precision
        // is not greater than the number of digits.
        prefix[prefix_size++] = '0';
      }
      writer.write_int(num_digits, get_prefix(), specs,
                       bin_writer<3>{abs_value, num_digits});
    }